

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O3

DTLSWriteEpoch * bssl::dtls_get_write_epoch(SSL *ssl,uint16_t epoch)

{
  byte bVar1;
  DTLS1_STATE *pDVar2;
  DTLSWriteEpoch *pDVar3;
  long lVar4;
  
  pDVar2 = ssl->d1;
  if (*(uint16_t *)((long)&(pDVar2->write_epoch).next_record.combined_ + 6) == epoch) {
    return &pDVar2->write_epoch;
  }
  bVar1 = (pDVar2->extra_write_epochs).size_;
  if (bVar1 != 0) {
    lVar4 = 0;
    do {
      pDVar3 = *(DTLSWriteEpoch **)((pDVar2->extra_write_epochs).storage_ + lVar4);
      if (*(uint16_t *)((long)&(pDVar3->next_record).combined_ + 6) == epoch) {
        return pDVar3;
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)bVar1 * 8 != lVar4);
  }
  return (DTLSWriteEpoch *)0x0;
}

Assistant:

DTLSWriteEpoch *dtls_get_write_epoch(const SSL *ssl, uint16_t epoch) {
  if (ssl->d1->write_epoch.epoch() == epoch) {
    return &ssl->d1->write_epoch;
  }
  for (const auto &e : ssl->d1->extra_write_epochs) {
    if (e->epoch() == epoch) {
      return e.get();
    }
  }
  return nullptr;
}